

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::rust::MultiCasePrefixStripper::MultiCasePrefixStripper
          (MultiCasePrefixStripper *this,string_view prefix)

{
  char *in_RCX;
  rust *this_00;
  string_view input;
  string_view input_00;
  
  input._M_len = prefix._M_str;
  this_00 = (rust *)prefix._M_len;
  (this->prefixes_)._M_elems[0]._M_dataplus._M_p = (pointer)&(this->prefixes_)._M_elems[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this,input._M_len,input._M_len + (long)this_00);
  input._M_str = in_RCX;
  ScreamingSnakeToUpperCamelCase_abi_cxx11_((this->prefixes_)._M_elems + 1,this_00,input);
  input_00._M_str = in_RCX;
  input_00._M_len = (size_t)input._M_len;
  CamelToSnakeCase_abi_cxx11_((this->prefixes_)._M_elems + 2,this_00,input_00);
  return;
}

Assistant:

MultiCasePrefixStripper::MultiCasePrefixStripper(absl::string_view prefix)
    : prefixes_{
          std::string(prefix),
          ScreamingSnakeToUpperCamelCase(prefix),
          CamelToSnakeCase(prefix),
      } {}